

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# snapshot_sync_ctx.cxx
# Opt level: O3

void __thiscall nuraft::snapshot_io_mgr::~snapshot_io_mgr(snapshot_io_mgr *this)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  int in_EDX;
  int in_ESI;
  
  shutdown(this,in_ESI,in_EDX);
  std::__cxx11::
  _List_base<std::shared_ptr<nuraft::snapshot_io_mgr::io_queue_elem>,_std::allocator<std::shared_ptr<nuraft::snapshot_io_mgr::io_queue_elem>_>_>
  ::_M_clear(&(this->queue_).
              super__List_base<std::shared_ptr<nuraft::snapshot_io_mgr::io_queue_elem>,_std::allocator<std::shared_ptr<nuraft::snapshot_io_mgr::io_queue_elem>_>_>
            );
  this_00 = (this->io_thread_ea_).
            super___shared_ptr<nuraft::EventAwaiter,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
  }
  if ((this->io_thread_)._M_id._M_thread == 0) {
    return;
  }
  std::terminate();
}

Assistant:

snapshot_io_mgr::~snapshot_io_mgr() {
    shutdown();
}